

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

long Assimp::IOSystem2Unzip::seek(voidpf param_1,voidpf stream,uLong offset,int origin)

{
  int iVar1;
  int iVar2;
  undefined4 local_34;
  aiOrigin assimp_origin;
  IOStream *io_stream;
  int origin_local;
  uLong offset_local;
  voidpf stream_local;
  voidpf param_0_local;
  
  if (origin == 0) {
    local_34 = 0;
  }
  else if ((origin == 1) || (origin != 2)) {
    local_34 = 1;
  }
  else {
    local_34 = 2;
  }
  iVar1 = (**(code **)(*stream + 0x20))(stream,offset,local_34);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  return (long)iVar2;
}

Assistant:

long IOSystem2Unzip::seek(voidpf /*opaque*/, voidpf stream, uLong offset, int origin) {
        IOStream* io_stream = (IOStream*)stream;

        aiOrigin assimp_origin;
        switch (origin) {
        default:
        case ZLIB_FILEFUNC_SEEK_CUR:
            assimp_origin = aiOrigin_CUR;
            break;
        case ZLIB_FILEFUNC_SEEK_END:
            assimp_origin = aiOrigin_END;
            break;
        case ZLIB_FILEFUNC_SEEK_SET:
            assimp_origin = aiOrigin_SET;
            break;
        }

        return (io_stream->Seek(offset, assimp_origin) == aiReturn_SUCCESS ? 0 : -1);
    }